

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxProjection.cpp
# Opt level: O1

double __thiscall BoxProjection::coordinateZ(BoxProjection *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  switch(G) {
  case 0:
    (this->super_Parameterization).x =
         (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).y =
         (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    dVar3 = (this->super_Parameterization).z_lb;
    goto LAB_00104a0f;
  case 1:
    dVar3 = (this->super_Parameterization).y_lb;
    (this->super_Parameterization).x =
         (this->super_Parameterization).x_ub - (double)J * (this->super_Parameterization).dx;
    break;
  case 2:
    (this->super_Parameterization).x = (this->super_Parameterization).x_lb;
    dVar3 = (double)J * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    break;
  case 3:
    dVar3 = (this->super_Parameterization).z_ub;
    (this->super_Parameterization).x =
         (this->super_Parameterization).x_ub - (double)J * (this->super_Parameterization).dx;
    (this->super_Parameterization).y =
         (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    goto LAB_00104a0f;
  case 4:
    (this->super_Parameterization).x =
         (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    dVar3 = (this->super_Parameterization).y_ub;
    break;
  case 5:
    (this->super_Parameterization).x = (this->super_Parameterization).x_ub;
    (this->super_Parameterization).y =
         (this->super_Parameterization).y_ub - (double)J * (this->super_Parameterization).dy;
    goto LAB_001049f8;
  default:
    goto switchD_001048ed_default;
  }
  (this->super_Parameterization).y = dVar3;
LAB_001049f8:
  dVar3 = (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
LAB_00104a0f:
  (this->super_Parameterization).z = dVar3;
switchD_001048ed_default:
  dVar3 = (this->super_Parameterization).z;
  dVar1 = (this->super_Parameterization).radius;
  dVar4 = (this->super_Parameterization).x;
  dVar2 = (this->super_Parameterization).y;
  dVar4 = dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  return dVar3 * (dVar1 / dVar4);
}

Assistant:

double BoxProjection::coordinateZ(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Lower z
      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;
      break;
    case 1:  // Lower y
      x = x_ub - (double)J * dx;
      y = y_lb;
      z = z_lb + (double)K * dz;
      break;
    case 2:  // Lower x
      x = x_lb;
      y = y_lb + (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
    case 3:  // Upper z
      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;
      break;
    case 4:  // Upper y
      x = x_lb + (double)J * dx;
      y = y_ub;
      z = z_lb + (double)K * dz;
      break;
    case 5:  // Upper x
      x = x_ub;
      y = y_ub - (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
  }

  return z * projection(x, y, z);
}